

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O0

Vector<double,_3U> * __thiscall
OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>::getVariance
          (Accumulator<OpenMD::Vector<double,_3U>_> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  uint i_00;
  long in_RSI;
  Vector<double,_3U> *in_RDI;
  size_t i;
  Vector<double,_3U> *var;
  undefined8 local_18;
  
  Vector<double,_3U>::Vector(in_RDI);
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    i_00 = (uint)local_18;
    pdVar4 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RSI + 0x50),i_00);
    dVar1 = *pdVar4;
    pdVar4 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RSI + 0x38),i_00);
    dVar2 = *pdVar4;
    pdVar4 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RSI + 0x38),i_00);
    dVar3 = *pdVar4;
    pdVar4 = Vector<double,_3U>::operator[](in_RDI,i_00);
    *pdVar4 = -dVar2 * dVar3 + dVar1;
    pdVar4 = Vector<double,_3U>::operator[](in_RDI,i_00);
    if (*pdVar4 <= 0.0 && *pdVar4 != 0.0) {
      pdVar4 = Vector<double,_3U>::operator[](in_RDI,i_00);
      *pdVar4 = 0.0;
    }
  }
  return in_RDI;
}

Assistant:

Vector<RealType, Dim> getVariance() const {
      assert(Count_ != 0);

      Vector<RealType, Dim> var {};

      for (std::size_t i = 0; i < Dim; i++) {
        var[i] = (Avg2_[i] - Avg_[i] * Avg_[i]);
        if (var[i] < 0) var[i] = 0;
      }

      return var;
    }